

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O2

QNetworkProxy __thiscall
QTcpServerPrivate::resolveProxy(QTcpServerPrivate *this,QHostAddress *address,quint16 port)

{
  bool bVar1;
  ProxyType PVar2;
  Capabilities CVar3;
  int iVar4;
  quint16 in_CX;
  undefined6 in_register_00000012;
  long lVar5;
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QNetworkProxyQuery query;
  QArrayDataPointer<QNetworkProxy> local_68;
  QArrayDataPointer<QNetworkProxy> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHostAddress::isLoopback((QHostAddress *)CONCAT62(in_register_00000012,port));
  if (bVar1) {
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QNetworkProxy *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (QNetworkProxy *)0x0;
    local_68.size = 0;
    query.d.d.ptr =
         (QSharedDataPointer<QNetworkProxyQueryPrivate>)
         (totally_ordered_wrapper<QNetworkProxyQueryPrivate_*>)0x0;
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,NoProxy,(QString *)&local_48,0,(QString *)&local_68,
               (QString *)&query);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&query);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  else {
    local_48.d = (Data *)0x0;
    local_48.ptr = (QNetworkProxy *)0x0;
    local_48.size = 0;
    PVar2 = QNetworkProxy::type((QNetworkProxy *)(address + 0x1c));
    if (PVar2 == DefaultProxy) {
      query.d.d.ptr = (QSharedDataPointer<QNetworkProxyQueryPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)0x0;
      local_68.ptr = (QNetworkProxy *)0x0;
      local_68.size = 0;
      QNetworkProxyQuery::QNetworkProxyQuery
                (&query,in_CX,(QString *)&local_68,
                 (uint)(*(int *)&address[0x15].d.d.ptr == 2) * 2 + TcpServer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QNetworkProxyFactory::proxyForQuery((QList<QNetworkProxy> *)&local_68,&query);
      QArrayDataPointer<QNetworkProxy>::operator=(&local_48,&local_68);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_68);
      QNetworkProxyQuery::~QNetworkProxyQuery(&query);
    }
    else {
      QList<QNetworkProxy>::emplaceBack<QNetworkProxy_const&>
                ((QList<QNetworkProxy> *)&local_48,(QNetworkProxy *)(address + 0x1c));
    }
    this_00 = local_48.ptr;
    for (lVar5 = local_48.size << 3; lVar5 != 0; lVar5 = lVar5 + -8) {
      iVar4 = *(int *)&address[0x15].d.d.ptr;
      if (iVar4 == 0) {
        CVar3 = QNetworkProxy::capabilities(this_00);
        if (((uint)CVar3.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                   super_QFlagsStorage<QNetworkProxy::Capability>.i & 2) == 0) {
          iVar4 = *(int *)&address[0x15].d.d.ptr;
          goto LAB_001b9f04;
        }
LAB_001b9f7b:
        QNetworkProxy::QNetworkProxy((QNetworkProxy *)this,this_00);
        goto LAB_001b9f86;
      }
LAB_001b9f04:
      if (iVar4 == 2) {
        CVar3 = QNetworkProxy::capabilities(this_00);
        if (((uint)CVar3.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
                   super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x40) != 0) goto LAB_001b9f7b;
      }
      this_00 = this_00 + 1;
    }
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (QNetworkProxy *)0x0;
    query.d.d.ptr =
         (QSharedDataPointer<QNetworkProxyQueryPrivate>)
         (totally_ordered_wrapper<QNetworkProxyQueryPrivate_*>)0x0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,DefaultProxy,(QString *)&local_68,0,(QString *)&query,
               (QString *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&query);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
LAB_001b9f86:
    QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSharedDataPointer<QNetworkProxyPrivate>)(QSharedDataPointer<QNetworkProxyPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkProxy QTcpServerPrivate::resolveProxy(const QHostAddress &address, quint16 port)
{
    if (address.isLoopback())
        return QNetworkProxy::NoProxy;

    QList<QNetworkProxy> proxies;
    if (proxy.type() != QNetworkProxy::DefaultProxy) {
        // a non-default proxy was set with setProxy
        proxies << proxy;
    } else {
        // try the application settings instead
        QNetworkProxyQuery query(port, QString(),
                                 socketType == QAbstractSocket::SctpSocket ?
                                 QNetworkProxyQuery::SctpServer :
                                 QNetworkProxyQuery::TcpServer);
        proxies = QNetworkProxyFactory::proxyForQuery(query);
    }

    // return the first that we can use
    for (const QNetworkProxy &p : std::as_const(proxies)) {
        if (socketType == QAbstractSocket::TcpSocket &&
            (p.capabilities() & QNetworkProxy::ListeningCapability) != 0)
            return p;

        if (socketType == QAbstractSocket::SctpSocket &&
            (p.capabilities() & QNetworkProxy::SctpListeningCapability) != 0)
            return p;
    }

    // no proxy found
    // DefaultProxy will raise an error
    return QNetworkProxy(QNetworkProxy::DefaultProxy);
}